

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

Leaf * __thiscall
kj::_::BTreeImpl::eraseHelper<kj::_::BTreeImpl::Leaf>
          (BTreeImpl *this,Leaf *node,Parent *parent,uint indexInParent,uint pos,MaybeUint **fixup)

{
  uint uVar1;
  Parent *dst;
  bool bVar2;
  uint uVar3;
  Leaf *pLVar4;
  Leaf *dst_00;
  Fault local_118;
  Fault f_5;
  Fault f_4;
  Parent **local_100;
  undefined1 local_f8 [8];
  DebugComparison<kj::_::BTreeImpl::Parent_*&,_kj::_::BTreeImpl::Parent_*> _kjCondition_4;
  Fault f_3;
  DebugExpression<bool> _kjCondition_3;
  Leaf *sib_1;
  uint sibPos_1;
  Fault f_2;
  Parent **local_a0;
  undefined1 local_98 [8];
  DebugComparison<kj::_::BTreeImpl::Parent_*&,_kj::_::BTreeImpl::Parent_*> _kjCondition_2;
  Fault f_1;
  DebugExpression<bool> _kjCondition_1;
  Leaf *sib;
  uint sibPos;
  Fault local_48;
  Fault f;
  DebugExpression<bool> _kjCondition;
  MaybeUint **fixup_local;
  uint pos_local;
  uint indexInParent_local;
  Parent *parent_local;
  Leaf *node_local;
  BTreeImpl *this_local;
  
  parent_local = (Parent *)node;
  if ((parent == (Parent *)0x0) ||
     (_pos_local = parent, node_local = (Leaf *)this, bVar2 = Leaf::isMostlyFull(node), bVar2)) {
    this_local = (BTreeImpl *)parent_local;
  }
  else {
    f.exception._6_1_ = Leaf::isHalfFull((Leaf *)parent_local);
    f.exception._7_1_ =
         DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
    bVar2 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7));
    if (!bVar2) {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                (&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                 ,0x1fb,FAILED,"node.isHalfFull()","_kjCondition,",
                 (DebugExpression<bool> *)((long)&f.exception + 7));
      Debug::Fault::fatal(&local_48);
    }
    if (indexInParent == 0) {
      bVar2 = MaybeUint::operator==(_pos_local->keys,(void *)0x0);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
                  (&local_118,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                   ,0x236,FAILED,(char *)0x0,"\"inconsistent b-tree\"",
                   (char (*) [20])"inconsistent b-tree");
        Debug::Fault::fatal(&local_118);
      }
      uVar1 = _pos_local->children[1];
      pLVar4 = NodeUnion::operator_cast_to_Leaf_(this->tree + uVar1);
      bVar2 = Leaf::isMostlyFull(pLVar4);
      if (bVar2) {
        rotateLeft(this,(Leaf *)parent_local,pLVar4,_pos_local,0,fixup);
        this_local = (BTreeImpl *)parent_local;
      }
      else {
        f_3.exception._6_1_ = Leaf::isHalfFull(pLVar4);
        f_3.exception._7_1_ =
             DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f_3.exception + 6))
        ;
        bVar2 = _::DebugExpression::operator_cast_to_bool
                          ((DebugExpression *)((long)&f_3.exception + 7));
        dst = parent_local;
        if (!bVar2) {
          Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    ((Fault *)&_kjCondition_4.result,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                     ,0x223,FAILED,"sib.isHalfFull()","_kjCondition,",
                     (DebugExpression<bool> *)((long)&f_3.exception + 7));
          Debug::Fault::fatal((Fault *)&_kjCondition_4.result);
        }
        uVar3 = MaybeUint::operator*(_pos_local->keys);
        merge(this,(Leaf *)dst,pos,uVar3,pLVar4);
        Parent::eraseAfter(_pos_local,0);
        free(this,(void *)(ulong)uVar1);
        if (*fixup == _pos_local->keys) {
          *fixup = (MaybeUint *)0x0;
        }
        bVar2 = MaybeUint::operator==(_pos_local->keys,(void *)0x0);
        if (bVar2) {
          local_100 = (Parent **)
                      DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&_::MAGIC_ASSERT,(Parent **)&pos_local);
          f_4.exception = (Exception *)this->tree;
          DebugExpression<kj::_::BTreeImpl::Parent*&>::operator==
                    ((DebugComparison<kj::_::BTreeImpl::Parent_*&,_kj::_::BTreeImpl::Parent_*> *)
                     local_f8,(DebugExpression<kj::_::BTreeImpl::Parent*&> *)&local_100,
                     (Parent **)&f_4);
          bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_f8);
          if (!bVar2) {
            Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::BTreeImpl::Parent*&,kj::_::BTreeImpl::Parent*>&>
                      (&f_5,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                       ,0x22b,FAILED,"parent == &tree->parent","_kjCondition,",
                       (DebugComparison<kj::_::BTreeImpl::Parent_*&,_kj::_::BTreeImpl::Parent_*> *)
                       local_f8);
            Debug::Fault::fatal(&f_5);
          }
          compilerBarrier();
          pLVar4 = NodeUnion::operator_cast_to_Leaf_(this->tree);
          move(this,pLVar4,0,(Leaf *)parent_local);
          free(this,(void *)(ulong)pos);
          this->height = this->height - 1;
          this_local = (BTreeImpl *)NodeUnion::operator_cast_to_Leaf_(this->tree);
        }
        else {
          this_local = (BTreeImpl *)parent_local;
        }
      }
    }
    else {
      uVar1 = _pos_local->children[indexInParent - 1];
      pLVar4 = NodeUnion::operator_cast_to_Leaf_(this->tree + uVar1);
      bVar2 = Leaf::isMostlyFull(pLVar4);
      if (bVar2) {
        rotateRight(this,pLVar4,(Leaf *)parent_local,_pos_local,indexInParent - 1);
        this_local = (BTreeImpl *)parent_local;
      }
      else {
        f_1.exception._6_1_ = Leaf::isHalfFull(pLVar4);
        f_1.exception._7_1_ =
             DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f_1.exception + 6))
        ;
        bVar2 = _::DebugExpression::operator_cast_to_bool
                          ((DebugExpression *)((long)&f_1.exception + 7));
        if (!bVar2) {
          Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    ((Fault *)&_kjCondition_2.result,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                     ,0x207,FAILED,"sib.isHalfFull()","_kjCondition,",
                     (DebugExpression<bool> *)((long)&f_1.exception + 7));
          Debug::Fault::fatal((Fault *)&_kjCondition_2.result);
        }
        uVar3 = MaybeUint::operator*(_pos_local->keys + (indexInParent - 1));
        merge(this,pLVar4,uVar1,uVar3,(Leaf *)parent_local);
        Parent::eraseAfter(_pos_local,indexInParent - 1);
        free(this,(void *)(ulong)pos);
        if (*fixup == _pos_local->keys + indexInParent) {
          *fixup = *fixup + -1;
        }
        bVar2 = MaybeUint::operator==(_pos_local->keys,(void *)0x0);
        this_local = (BTreeImpl *)pLVar4;
        if (bVar2) {
          local_a0 = (Parent **)
                     DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&_::MAGIC_ASSERT,(Parent **)&pos_local);
          f_2.exception = (Exception *)this->tree;
          DebugExpression<kj::_::BTreeImpl::Parent*&>::operator==
                    ((DebugComparison<kj::_::BTreeImpl::Parent_*&,_kj::_::BTreeImpl::Parent_*> *)
                     local_98,(DebugExpression<kj::_::BTreeImpl::Parent*&> *)&local_a0,
                     (Parent **)&f_2);
          bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
          if (!bVar2) {
            Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::BTreeImpl::Parent*&,kj::_::BTreeImpl::Parent*>&>
                      ((Fault *)&stack0xffffffffffffff50,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                       ,0x20f,FAILED,"parent == &tree->parent","_kjCondition,",
                       (DebugComparison<kj::_::BTreeImpl::Parent_*&,_kj::_::BTreeImpl::Parent_*> *)
                       local_98);
            Debug::Fault::fatal((Fault *)&stack0xffffffffffffff50);
          }
          compilerBarrier();
          dst_00 = NodeUnion::operator_cast_to_Leaf_(this->tree);
          move(this,dst_00,0,pLVar4);
          free(this,(void *)(ulong)uVar1);
          this->height = this->height - 1;
          this_local = (BTreeImpl *)NodeUnion::operator_cast_to_Leaf_(this->tree);
        }
      }
    }
  }
  return (Leaf *)this_local;
}

Assistant:

Node& BTreeImpl::eraseHelper(
    Node& node, Parent* parent, uint indexInParent, uint pos, MaybeUint*& fixup) {
  if (parent != nullptr && !node.isMostlyFull()) {
    // This is not the root, but it's only half-full. Rebalance.
    KJ_DASSERT(node.isHalfFull());

    if (indexInParent > 0) {
      // There's a sibling to the left.
      uint sibPos = parent->children[indexInParent - 1];
      Node& sib = tree[sibPos];
      if (sib.isMostlyFull()) {
        // Left sibling is more than half full. Steal one member.
        rotateRight(sib, node, *parent, indexInParent - 1);
        return node;
      } else {
        // Left sibling is half full, too. Merge.
        KJ_ASSERT(sib.isHalfFull());
        merge(sib, sibPos, *parent->keys[indexInParent - 1], node);
        parent->eraseAfter(indexInParent - 1);
        free(pos);
        if (fixup == &parent->keys[indexInParent]) --fixup;

        if (parent->keys[0] == nullptr) {
          // Oh hah, the parent has no keys left. It must be the root. We can eliminate it.
          KJ_DASSERT(parent == &tree->parent);
          compilerBarrier();  // don't reorder any writes to parent below here
          move(tree[0], 0, sib);
          free(sibPos);
          --height;
          return tree[0];
        } else {
          return sib;
        }
      }
    } else if (indexInParent < Parent::NKEYS && parent->keys[indexInParent] != nullptr) {
      // There's a sibling to the right.
      uint sibPos = parent->children[indexInParent + 1];
      Node& sib = tree[sibPos];
      if (sib.isMostlyFull()) {
        // Right sibling is more than half full. Steal one member.
        rotateLeft(node, sib, *parent, indexInParent, fixup);
        return node;
      } else {
        // Right sibling is half full, too. Merge.
        KJ_ASSERT(sib.isHalfFull());
        merge(node, pos, *parent->keys[indexInParent], sib);
        parent->eraseAfter(indexInParent);
        free(sibPos);
        if (fixup == &parent->keys[indexInParent]) fixup = nullptr;

        if (parent->keys[0] == nullptr) {
          // Oh hah, the parent has no keys left. It must be the root. We can eliminate it.
          KJ_DASSERT(parent == &tree->parent);
          compilerBarrier();  // don't reorder any writes to parent below here
          move(tree[0], 0, node);
          free(pos);
          --height;
          return tree[0];
        } else {
          return node;
        }
      }
    } else {
      KJ_FAIL_ASSERT("inconsistent b-tree");
    }
  }

  return node;
}